

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O2

int epoll_fd_state(fd_state **fds_p,knote *kn,_Bool disabled)

{
  fd_state *pfVar1;
  uint uVar2;
  uint uVar3;
  fd_state local_58;
  
  pfVar1 = *fds_p;
  if ((pfVar1 == (fd_state *)0x0) && (pfVar1 = kn->kn_fds, pfVar1 == (fd_state *)0x0)) {
    local_58.fds_read = (knote *)0x0;
    local_58.fds_write = (knote *)0x0;
    local_58.fds_udata.field_0.ud_kn = (knote *)0x0;
    local_58.fds_entries.rbe_parent = (fd_state *)0x0;
    local_58.fds_entries.rbe_color = 0;
    local_58.fds_entries._28_4_ = 0;
    local_58.fds_entries.rbe_left = (fd_state *)0x0;
    local_58.fds_entries.rbe_right = (fd_state *)0x0;
    local_58.fds_udata.ud_type = 0;
    local_58.fds_udata._12_4_ = 0;
    local_58._36_4_ = 0;
    local_58.fds_fd = (uint)(kn->kev).ident;
    pfVar1 = fd_st_RB_FIND(&kn->kn_kq->kq_fd_st,&local_58);
    if (pfVar1 == (fd_state *)0x0) {
      return 0;
    }
  }
  *fds_p = pfVar1;
  uVar2 = 0;
  uVar3 = 0;
  if (pfVar1->fds_read != (knote *)0x0) {
    uVar3 = (uint)((((pfVar1->fds_read->kev).flags & 0x8008) == 0) != disabled);
  }
  if (pfVar1->fds_write != (knote *)0x0) {
    uVar2 = (uint)((((pfVar1->fds_write->kev).flags & 0x8008) == 0) != disabled) << 2;
  }
  return uVar2 | uVar3;
}

Assistant:

int epoll_fd_state(struct fd_state **fds_p, struct knote *kn, bool disabled)
{
    int             state = 0;
    int             fd = kn->kev.ident;
    struct fd_state *fds = *fds_p;

    if (!fds) {
        fds = kn->kn_fds;
        if(fds) dbg_printf("fd_state: from-kn fd=%i", fd);
    }
    if (!fds) {
        dbg_printf("fd_state: find fd=%i", fd);

        fds = RB_FIND(fd_st, &kn->kn_kq->kq_fd_st, &(struct fd_state){ .fds_fd = fd });
        if (!fds) return (0);
    }

    *fds_p = fds;

    state |= (fds->fds_read && (disabled == ((fds->fds_read->kev.flags & (EV_DISABLE | EV_EOF)) != 0))) * EPOLLIN;
    state |= (fds->fds_write && (disabled == ((fds->fds_write->kev.flags & (EV_DISABLE | EV_EOF)) != 0))) * EPOLLOUT;

    return state;
}